

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  size_t __i;
  long lVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  double dVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [11];
  undefined1 auVar20 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int value;
  uniform_int_distribution<int> dis;
  set<int,_std::less<int>,_std::allocator<int>_> all;
  mt19937 gen;
  random_device rd;
  int local_3794;
  double local_3790;
  uint local_3784;
  double local_3780;
  uniform_int_distribution<int> local_3778;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> local_3770 [8];
  undefined4 local_3768 [2];
  undefined8 local_3760;
  undefined4 *local_3758;
  undefined4 *local_3750;
  undefined8 local_3748;
  byte local_3740 [4096];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar18 [12];
  undefined1 auVar27 [16];
  undefined1 auVar19 [13];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar29 [16];
  char cVar33;
  
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar3;
  lVar10 = 1;
  uVar6 = local_2740._M_x[0];
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar10);
    local_2740._M_x[lVar10] = uVar6;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x270);
  local_2740._M_p = 0x270;
  memset(local_3740,0,0x1000);
  local_3790 = 0.0;
  lVar10 = 0;
  do {
    local_3784 = *(uint *)((long)&DAT_001020a0 + lVar10);
    local_3778._M_param._M_a = 1;
    local_3768[0] = 0;
    local_3760 = 0;
    local_3758 = local_3768;
    local_3748 = 0;
    iVar11 = 1000000;
    local_3778._M_param._M_b = local_3784;
    local_3750 = local_3758;
    do {
      local_3794 = std::uniform_int_distribution<int>::operator()
                             (&local_3778,&local_2740,&local_3778._M_param);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_3770,&local_3794);
      uVar2 = local_3748;
      uVar3 = (uint)(local_3794 * -0x3361d2af) >> 0x11 | local_3794 * 0x16a88000;
      uVar3 = (uVar3 * -0x194da000 | uVar3 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
      uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 4) * -0x7a143595;
      uVar4 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
      uVar12 = uVar4 >> 0x10 ^ uVar4;
      uVar3 = 1;
      if ((uVar12 & 1) == 0) {
        bVar13 = (uVar12 & 0xfffe) == 0;
        uVar3 = uVar4 >> 0x10;
        if (!bVar13) {
          uVar3 = uVar12;
        }
        uVar8 = (uint)bVar13 * 0x10;
        uVar9 = uVar8 | 9;
        uVar12 = uVar3 >> 8;
        if ((char)uVar3 != '\0') {
          uVar9 = uVar8 + 1;
          uVar12 = uVar3;
        }
        uVar8 = uVar9 + 4;
        uVar1 = uVar12 >> 4;
        if ((uVar12 & 0xf) != 0) {
          uVar8 = uVar9;
          uVar1 = uVar12;
        }
        uVar3 = uVar8 + 2;
        uVar12 = uVar1 >> 2;
        if ((uVar1 & 3) != 0) {
          uVar3 = uVar8;
          uVar12 = uVar1;
        }
        uVar3 = uVar3 - (uVar12 & 1);
        if (0x13 < uVar3) {
          uVar3 = 0x14;
        }
        uVar3 = uVar3 + 1;
      }
      if (uVar3 <= (uint)(int)(char)local_3740[uVar4 >> 0x14]) {
        uVar3 = (int)(char)local_3740[uVar4 >> 0x14];
      }
      local_3740[uVar4 >> 0x14] = (byte)uVar3;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    dVar14 = 0.0;
    lVar7 = 0;
    do {
      dVar14 = dVar14 + (double)(((ulong)local_3740[lVar7] ^ 0x3ff) << 0x34);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x1000);
    dVar14 = 12098218.894406674 / dVar14;
    if (dVar14 <= 10240.0) {
      lVar15 = 0;
      lVar16 = 0;
      lVar7 = 0;
      do {
        auVar31[0] = -((char)*(undefined2 *)(local_3740 + lVar7) == '\0');
        cVar33 = -((char)((ushort)*(undefined2 *)(local_3740 + lVar7) >> 8) == '\0');
        auVar25._0_9_ = CONCAT18(0xff,0xff00000000000000);
        auVar17._0_10_ = CONCAT19(0xff,auVar25._0_9_);
        auVar17[10] = 0xff;
        auVar18[0xb] = 0xff;
        auVar18._0_11_ = auVar17;
        auVar19[0xc] = 0xff;
        auVar19._0_12_ = auVar18;
        auVar30[0xd] = 0xff;
        auVar30._0_13_ = auVar19;
        auVar30[0xe] = 0xff;
        auVar30[0xf] = 0xff;
        auVar29._14_2_ = auVar30._14_2_;
        auVar29[0xd] = 0xff;
        auVar29._0_13_ = auVar19;
        auVar28._13_3_ = auVar29._13_3_;
        auVar28[0xc] = 0xff;
        auVar28._0_12_ = auVar18;
        auVar27._12_4_ = auVar28._12_4_;
        auVar27[0xb] = 0xff;
        auVar27._0_11_ = auVar17;
        auVar26._11_5_ = auVar27._11_5_;
        auVar26[10] = 0xff;
        auVar26._0_10_ = auVar17._0_10_;
        auVar25._10_6_ = auVar26._10_6_;
        auVar25[9] = 0xff;
        auVar24._9_7_ = auVar25._9_7_;
        auVar24[8] = 0xff;
        auVar24._0_8_ = 0xff00000000000000;
        auVar23._8_8_ = auVar24._8_8_;
        auVar23._0_8_ = 0xff00000000000000;
        auVar22._7_9_ = auVar23._7_9_;
        auVar22._0_7_ = 0xff000000000000;
        auVar21._6_10_ = auVar22._6_10_;
        auVar21._0_6_ = 0xff0000000000;
        auVar20._5_11_ = auVar21._5_11_;
        auVar20._0_5_ = 0xff00000000;
        auVar31._4_12_ = auVar20._4_12_;
        auVar31[3] = cVar33;
        auVar31[2] = cVar33;
        auVar31[1] = auVar31[0];
        auVar31 = pshuflw(auVar31,auVar31,0xd4);
        auVar32._12_4_ = auVar31._12_4_;
        auVar32._0_8_ = auVar31._0_8_;
        auVar32._8_4_ = auVar31._4_4_;
        lVar15 = lVar15 + SUB168(auVar32 & _DAT_00102060,0);
        lVar16 = lVar16 + SUB168(auVar32 & _DAT_00102060,8);
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0x1000);
      if (lVar16 + lVar15 != 0) {
        dVar14 = 4096.0 / (double)(lVar16 + lVar15);
        local_3780 = 4096.0;
        goto LAB_00101541;
      }
    }
    else if (143165576.53333333 < dVar14) {
      dVar14 = dVar14 * -2.3283064365386963e-10 + 1.0;
      local_3780 = -4294967296.0;
LAB_00101541:
      dVar14 = log(dVar14);
      dVar14 = dVar14 * local_3780;
    }
    iVar5 = ((uint)(long)dVar14 |
            (uint)(long)(dVar14 - 9.223372036854776e+18) & (uint)((long)dVar14 >> 0x3f)) -
            (int)uVar2;
    iVar11 = -iVar5;
    if (0 < iVar5) {
      iVar11 = iVar5;
    }
    local_3790 = local_3790 + (double)iVar11 / (double)(int)uVar2;
    printf("%d numbers in range [1 .. %d], %d uniq, %d result, %.5f relative error\n",1000000,
           (ulong)local_3784);
    memset(local_3740,0,0x1000);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_3770);
    lVar10 = lVar10 + 4;
    if (lVar10 == 0x20) {
      printf("Average error: %.5f\n",local_3790 * 0.125);
      printf("Paper estimated error: %.5f\n",0x3f90a3d70a3d70a4);
      std::random_device::_M_fini();
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    std::random_device rd;
    std::mt19937 gen(rd());

    constexpr int N = (int) 1e6;

    double error_count = 0.0;
    int count = 0;


    hll::hyper_log_log<int, 12> counter{};
    for (int k : {100, 1000, 10000, N / 10, N, N * 10, N * 100, N * 1000}) {
        std::uniform_int_distribution<> dis(1, k);
        std::set<int> all;

        for (int i = 0; i < N; i++) {
            int value = dis(gen);
            all.insert(value);
            counter.add(value);
        }
        int expected = (int) all.size();
        int counter_result = counter.count();
        double error = relative_error(expected, counter_result);
        error_count += error;
        count += 1;
        printf("%d numbers in range [1 .. %d], %d uniq, %d result, %.5f relative error\n", N, k, expected, counter_result, error);

        counter.clear();
    }

    printf("Average error: %.5f\n", error_count / count);
    printf("Paper estimated error: %.5f\n", counter.get_relative_error());
    return 0;
}